

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_file_nametoolong(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char acStack_101c8 [8];
  char name [65537];
  int r;
  uv_fs_t req;
  
  loop = uv_default_loop();
  memset(acStack_101c8,0x61,0x10000);
  name[0xfff8] = '\0';
  name._65532_4_ =
       uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(name + 0x10000),acStack_101c8,0,0,(uv_fs_cb)0x0);
  if (name._65532_4_ != -0x24) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x2ef,"r == UV_ENAMETOOLONG");
    abort();
  }
  if (req.cb != (uv_fs_cb)0xffffffffffffffdc) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x2f0,"req.result == UV_ENAMETOOLONG");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)(name + 0x10000));
  name._65532_4_ =
       uv_fs_open(loop,(uv_fs_t *)(name + 0x10000),acStack_101c8,0,0,open_nametoolong_cb);
  if (name._65532_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x2f4,"r == 0");
    abort();
  }
  if (open_cb_count != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x2f6,"open_cb_count == 0");
    abort();
  }
  uv_run(loop,UV_RUN_DEFAULT);
  if (open_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x2f8,"open_cb_count == 1");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x2fa,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(fs_file_nametoolong) {
  uv_fs_t req;
  int r;
  char name[TOO_LONG_NAME_LENGTH + 1];

  loop = uv_default_loop();

  memset(name, 'a', TOO_LONG_NAME_LENGTH);
  name[TOO_LONG_NAME_LENGTH] = 0;

  r = uv_fs_open(NULL, &req, name, O_RDONLY, 0, NULL);
  ASSERT(r == UV_ENAMETOOLONG);
  ASSERT(req.result == UV_ENAMETOOLONG);
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(loop, &req, name, O_RDONLY, 0, open_nametoolong_cb);
  ASSERT(r == 0);

  ASSERT(open_cb_count == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(open_cb_count == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}